

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  float thickness;
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImGuiContext *pIVar7;
  ImU32 IVar8;
  undefined7 in_register_00000031;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec4 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  local_68 = p_min;
  local_60 = p_max;
  ImDrawList::AddRectFilled(pIVar1->DrawList,&local_68,&local_60,fill_col,rounding,0xf);
  if (((int)CONCAT71(in_register_00000031,border) != 0) &&
     (thickness = (pIVar7->Style).FrameBorderSize, 0.0 < thickness)) {
    pIVar2 = pIVar1->DrawList;
    local_38.y = local_68.y + 1.0;
    local_38.x = local_68.x + 1.0;
    local_40.y = local_60.y + 1.0;
    local_40.x = local_60.x + 1.0;
    local_58.x = (GImGui->Style).Colors[6].x;
    local_58.y = (GImGui->Style).Colors[6].y;
    uVar3 = (GImGui->Style).Colors[6].z;
    uVar4 = (GImGui->Style).Colors[6].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar4;
    local_58.z = (float)uVar3;
    IVar8 = ColorConvertFloat4ToU32(&local_58);
    ImDrawList::AddRect(pIVar2,&local_38,&local_40,IVar8,rounding,0xf,thickness);
    pIVar2 = pIVar1->DrawList;
    local_58.x = (GImGui->Style).Colors[5].x;
    local_58.y = (GImGui->Style).Colors[5].y;
    uVar5 = (GImGui->Style).Colors[5].z;
    uVar6 = (GImGui->Style).Colors[5].w;
    local_58.w = (GImGui->Style).Alpha * (float)uVar6;
    local_58.z = (float)uVar5;
    IVar8 = ColorConvertFloat4ToU32(&local_58);
    ImDrawList::AddRect(pIVar2,&local_68,&local_60,IVar8,rounding,0xf,thickness);
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    const float border_size = g.Style.FrameBorderSize;
    if (border && border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min+ImVec2(1,1), p_max+ImVec2(1,1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}